

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::verify
          (ProgramBinaryPersistenceCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  int extraout_EAX;
  ProgramBinary currentBinary;
  undefined1 local_1a0 [384];
  
  pTVar1 = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProgramBinaryCase::getProgramBinary
            (&this->super_ProgramBinaryCase,&currentBinary,*(GLuint *)(ctx + 8));
  if (*(GLenum *)sig == currentBinary.format) {
    if ((long)*(uchar **)(sig + 0x10) - (long)*(uchar **)(sig + 8) ==
        (long)currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      bVar2 = std::__equal<true>::equal<unsigned_char>
                        (*(uchar **)(sig + 8),*(uchar **)(sig + 0x10),
                         currentBinary.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if (bVar2) goto LAB_00f8639b;
    }
  }
  this_00 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Fail, program binary may only change as a result of linking or loading.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  tcu::TestContext::setTestResult
            ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Program binary changed");
LAB_00f8639b:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&currentBinary.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return extraout_EAX;
}

Assistant:

void ProgramBinaryPersistenceCase::verify (glu::Program& program, const ProgramBinary& binary)
{
	TestLog&		log				= m_testCtx.getLog();
	ProgramBinary	currentBinary;

	getProgramBinary(currentBinary, program.getProgram());

	if (!programBinariesEqual(binary, currentBinary))
	{
		log << TestLog::Message << "Fail, program binary may only change as a result of linking or loading." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program binary changed");
	}
}